

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTis.c
# Opt level: O3

void Gia_ManTisCollectMffc_rec(Gia_Man_t *p,int Id,Vec_Int_t *vMffc,Vec_Int_t *vLeaves)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  
  if (p->nTravIdsAlloc <= Id) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x23f,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[Id] != p->nTravIds) {
    p->pTravIds[Id] = p->nTravIds;
    p_00 = vLeaves;
    if (p->pRefs[Id] < 2) {
      if ((Id < 0) || (p->nObjs <= Id)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      uVar2 = (uint)*(undefined8 *)(pGVar1 + (uint)Id);
      if ((~uVar2 & 0x9fffffff) != 0) {
        if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTis.c"
                        ,0x74,
                        "void Gia_ManTisCollectMffc_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        Gia_ManTisCollectMffc_rec(p,Id - (uVar2 & 0x1fffffff),vMffc,vLeaves);
        Gia_ManTisCollectMffc_rec
                  (p,Id - (*(uint *)&pGVar1[(uint)Id].field_0x4 & 0x1fffffff),vMffc,vLeaves);
        p_00 = vMffc;
        if (p->pMuxes != (uint *)0x0) {
          uVar2 = p->pMuxes[Id];
          if (uVar2 != 0) {
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            Gia_ManTisCollectMffc_rec(p,uVar2 >> 1,vMffc,vLeaves);
          }
        }
      }
    }
    Vec_IntPush(p_00,Id);
    return;
  }
  return;
}

Assistant:

void Gia_ManTisCollectMffc_rec( Gia_Man_t * p, int Id, Vec_Int_t * vMffc, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    if ( Gia_ObjRefNumId(p, Id) > 1 )
    {
        Vec_IntPush( vLeaves, Id );
        return;
    }
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vLeaves, Id );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId0(pObj, Id), vMffc, vLeaves );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId1(pObj, Id), vMffc, vLeaves );
    if ( Gia_ObjIsMuxId(p, Id) )
        Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId2(p, Id), vMffc, vLeaves );
    Vec_IntPush( vMffc, Id );
}